

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedSnapshotRecord.cpp
# Opt level: O0

void __thiscall
cali::CompressedSnapshotRecordView::unpack_immediate
          (CompressedSnapshotRecordView *this,size_t n,cali_id_t *attr_vec,Variant *data_vec)

{
  unsigned_long *puVar1;
  uint64_t uVar2;
  uint64_t *puVar3;
  Variant VVar4;
  uint64_t local_50;
  anon_union_8_7_33918203_for_value local_48;
  ulong local_40;
  size_t i;
  size_t pos;
  size_t max;
  Variant *data_vec_local;
  cali_id_t *attr_vec_local;
  size_t n_local;
  CompressedSnapshotRecordView *this_local;
  
  max = (size_t)data_vec;
  data_vec_local = (Variant *)attr_vec;
  attr_vec_local = (cali_id_t *)n;
  n_local = (size_t)this;
  puVar1 = std::min<unsigned_long>((unsigned_long *)&attr_vec_local,&this->m_num_imm);
  pos = *puVar1;
  i = this->m_imm_pos + 1;
  for (local_40 = 0; local_40 < pos; local_40 = local_40 + 1) {
    uVar2 = vldec_u64(this->m_buffer + i,&i);
    (&(data_vec_local->m_v).type_and_size)[local_40] = uVar2;
    VVar4 = Variant::unpack(this->m_buffer + i,&i,(bool *)0x0);
    puVar3 = (uint64_t *)(max + local_40 * 0x10);
    local_50 = VVar4.m_v.type_and_size;
    *puVar3 = local_50;
    local_48 = VVar4.m_v.value;
    ((anon_union_8_7_33918203_for_value *)(puVar3 + 1))->v_uint = (uint64_t)local_48;
  }
  return;
}

Assistant:

void CompressedSnapshotRecordView::unpack_immediate(size_t n, cali_id_t attr_vec[], Variant data_vec[]) const
{
    size_t max = std::min(n, m_num_imm);
    size_t pos = m_imm_pos + 1;

    for (size_t i = 0; i < max; ++i) {
        attr_vec[i] = vldec_u64(m_buffer + pos, &pos);
        data_vec[i] = Variant::unpack(m_buffer + pos, &pos, nullptr);
    }
}